

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m6502.h
# Opt level: O3

uint8_t __thiscall m6502::ASL(m6502 *this)

{
  byte bVar1;
  pointer __n;
  
  fetch(this);
  bVar1 = this->fetched;
  this->status = bVar1 * '\x02' & 0x80 | bVar1 >> 7 | this->status & 0x7c |
                 ((bVar1 & 0x7f) == 0) * '\x02';
  __n = (this->lookup).super__Vector_base<m6502::INSTRUCTION,_std::allocator<m6502::INSTRUCTION>_>.
        _M_impl.super__Vector_impl_data._M_start;
  if (((code *)__n[this->opcode].addrmode == IMP) && (*(long *)&__n[this->opcode].field_0x38 == 0))
  {
    this->a = bVar1 * '\x02';
  }
  else {
    write(this,(uint)this->addrAbs,(void *)(ulong)(byte)(bVar1 * '\x02'),(size_t)__n);
  }
  return '\0';
}

Assistant:

uint8_t ASL()
  {
    fetch();
    uint16_t tmp = (uint16_t)fetched << 1;
    SetFlag(C, tmp & 0xFF00u);
    SetFlag(Z, (tmp & 0x00FFu) == 0);
    SetFlag(N, tmp & 0x80u);
    if (lookup[opcode].addrmode == &m6502::IMP)
    {
      a = tmp & 0x00FFu;
    }
    else
    {
      write(addrAbs, tmp & 0x00FFu);
    }
    return 0;
  }